

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int splice)

{
  int64_t iVar1;
  JSValue val_00;
  JSValue val_01;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  int64_t *piVar7;
  ulong uVar8;
  int64_t iVar9;
  long lVar10;
  JSObject *p_2;
  ulong uVar11;
  JSValueUnion JVar12;
  uint uVar13;
  JSObject *p_1;
  bool bVar14;
  JSValue v;
  JSValue obj;
  JSValue JVar15;
  JSValue len_val;
  JSValue prop;
  JSValue prop_00;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  int64_t start;
  int64_t len;
  JSValue val;
  int local_b0;
  ulong local_a8;
  long local_a0;
  int64_t local_98;
  ulong local_90;
  JSValueUnion local_88;
  int64_t iStack_80;
  JSValueUnion local_70;
  long local_68;
  ulong local_60;
  JSValue *local_58;
  ulong local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  uVar6 = (ulong)(uint)argc;
  obj = JS_ToObject(ctx,this_val);
  JVar3 = obj.u;
  iVar2 = js_get_length64(ctx,(int64_t *)&local_50,obj);
  uVar13 = (uint)obj.tag;
  if (iVar2 != 0) {
    JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    uVar8 = 0;
    goto LAB_0016341a;
  }
  iVar2 = JS_ToInt64Clamp(ctx,&local_a0,*argv,0,local_50,local_50);
  if (iVar2 != 0) {
LAB_00163415:
    uVar8 = 0;
    JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_0016341a;
  }
  if (splice == 0) {
    local_a8 = local_50;
    if ((int)argv[1].tag != 3) {
      JVar15.tag = argv[1].tag;
      JVar15.u.ptr = argv[1].u.ptr;
      iVar2 = JS_ToInt64Clamp(ctx,(int64_t *)&local_a8,JVar15,0,local_50,local_50);
      uVar8 = 0;
      JVar15 = (JSValue)(ZEXT816(3) << 0x40);
      if (iVar2 != 0) goto LAB_0016341a;
    }
    uVar6 = 0;
    uVar4 = local_a8 - local_a0;
    if ((long)(local_a8 - local_a0) < 1) {
      uVar4 = uVar6;
    }
  }
  else {
    uVar4 = uVar6;
    if (argc != 0) {
      if (argc == 1) {
        uVar6 = 0;
        uVar4 = local_50 - local_a0;
      }
      else {
        iVar2 = JS_ToInt64Clamp(ctx,(int64_t *)&local_a8,argv[1],0,local_50 - local_a0,0);
        if (iVar2 != 0) goto LAB_00163415;
        uVar6 = (ulong)(argc - 2);
        uVar4 = local_a8;
      }
    }
    local_60 = uVar4;
    if (0x1fffffffffffff < (long)((uVar6 + local_50) - uVar4)) {
      JS_ThrowTypeError(ctx,"Array loo long");
      goto LAB_00163415;
    }
  }
  bVar14 = (long)(int)uVar4 == uVar4;
  JVar12.float64 = (double)(long)uVar4;
  if (bVar14) {
    JVar12.ptr = (void *)(uVar4 & 0xffffffff);
  }
  iVar9 = 7;
  if (bVar14) {
    iVar9 = 0;
  }
  len_val.tag = iVar9;
  len_val.u.float64 = JVar12.float64;
  local_58 = argv;
  JVar15 = JS_ArraySpeciesCreate(ctx,obj,len_val);
  JVar12 = JVar15.u;
  uVar8 = (ulong)JVar12.ptr >> 0x20;
  if ((JVar15.tag & 0xffffffffU) == 6) goto LAB_0016341a;
  local_90 = uVar4 + local_a0;
  local_98 = local_a0;
  if (((((uVar13 == 0xffffffff) && (*(short *)((long)JVar3.ptr + 6) == 2)) &&
       ((*(byte *)((long)JVar3.ptr + 5) & 8) != 0)) &&
      (((int)JVar15.tag == -1 && (*(short *)((long)JVar12.ptr + 6) == 2)))) &&
     ((*(byte *)((long)JVar12.ptr + 5) & 8) != 0)) {
    uVar4 = (ulong)*(uint *)((long)JVar3.ptr + 0x40);
    if ((long)local_90 < (long)(ulong)*(uint *)((long)JVar3.ptr + 0x40)) {
      uVar4 = local_90;
    }
    if ((void *)(uVar4 - local_a0) == (void *)0x0 || (long)uVar4 < local_a0) goto LAB_00163748;
    piVar7 = (int64_t *)(local_a0 * 0x10 + *(long *)((long)JVar3.ptr + 0x38) + 8);
    local_68 = local_a0 - uVar4;
    uVar11 = 0;
    local_70.ptr = (void *)(uVar4 - local_a0);
    do {
      local_88 = (JSValueUnion)((JSValueUnion *)(piVar7 + -1))->ptr;
      iStack_80 = *piVar7;
      if (0xfffffff4 < (uint)iStack_80) {
        *(int *)local_88.ptr = *local_88.ptr + 1;
      }
      JVar12.float64 = (double)(long)uVar11;
      if (uVar11 < 0x80000000) {
        JVar12.ptr = (void *)(uVar11 & 0xffffffff);
      }
      iVar9 = 7;
      if (uVar11 < 0x80000000) {
        iVar9 = 0;
      }
      val_00.tag = iStack_80;
      val_00.u.ptr = local_88.ptr;
      prop.tag = iVar9;
      prop.u.float64 = JVar12.float64;
      iVar2 = JS_DefinePropertyValueValue(ctx,JVar15,prop,val_00,0x4007);
      if (iVar2 < 0) goto LAB_0016341a;
      uVar11 = uVar11 + 1;
      piVar7 = piVar7 + 2;
    } while (local_68 + uVar11 != 0);
    local_a0 = uVar11 + local_98;
    JVar12 = local_70;
  }
  else {
LAB_00163748:
    JVar12.float64 = 0.0;
  }
  lVar10 = local_a0;
  if (local_a0 < (long)local_90) {
    do {
      iVar2 = JS_TryGetPropertyInt64(ctx,obj,lVar10,(JSValue *)&local_48);
      if (iVar2 < 0) goto LAB_0016341a;
      if (iVar2 != 0) {
        JVar5.float64 = (double)JVar12.float64;
        if (JVar12.ptr < (void *)0x80000000) {
          JVar5.float64 = JVar12.float64 & 0xffffffff;
        }
        local_88.float64 = local_48.float64;
        iStack_80 = iStack_40;
        iVar9 = 7;
        if (JVar12.ptr < (void *)0x80000000) {
          iVar9 = 0;
        }
        val_01.tag = iStack_40;
        val_01.u.float64 = local_48.float64;
        prop_00.tag = iVar9;
        prop_00.u.float64 = JVar5.float64;
        iVar2 = JS_DefinePropertyValueValue(ctx,JVar15,prop_00,val_01,0x4007);
        if (iVar2 < 0) goto LAB_0016341a;
      }
      lVar10 = lVar10 + 1;
      JVar12.float64 = JVar12.float64 + 1;
    } while (lVar10 < (long)local_90);
  }
  JVar5.float64 = (double)JVar12.float64;
  if (JVar12.ptr < (void *)0x80000000) {
    JVar5 = JVar12;
  }
  iVar9 = 7;
  if (JVar12.ptr < (void *)0x80000000) {
    iVar9 = 0;
  }
  val_02.tag = iVar9;
  val_02.u.float64 = JVar5.float64;
  iVar2 = JS_SetPropertyInternal(ctx,JVar15,0x30,val_02,0x4000);
  if (-1 < iVar2) {
    if (splice == 0) {
LAB_00163932:
      if (uVar13 < 0xfffffff5) {
        return JVar15;
      }
      iVar2 = *JVar3.ptr;
      *(int *)JVar3.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return JVar15;
      }
      __JS_FreeValueRT(ctx->rt,obj);
      return JVar15;
    }
    uVar4 = (uVar6 + local_50) - local_60;
    if (local_60 == uVar6) {
LAB_0016387a:
      local_b0 = (int)uVar6;
      if (local_b0 != 0) {
        lVar10 = 0;
        iVar9 = local_98;
        do {
          JVar12 = (JSValueUnion)((JSValueUnion *)((long)&local_58[2].u + lVar10))->ptr;
          iVar1 = *(int64_t *)((long)&local_58[2].tag + lVar10);
          if (0xfffffff4 < (uint)iVar1) {
            *(int *)JVar12.ptr = *JVar12.ptr + 1;
          }
          val_03.tag = iVar1;
          val_03.u.ptr = JVar12.ptr;
          iVar2 = JS_SetPropertyInt64(ctx,obj,iVar9,val_03);
          if (iVar2 < 0) goto LAB_0016341a;
          lVar10 = lVar10 + 0x10;
          iVar9 = iVar9 + 1;
        } while (uVar6 << 4 != lVar10);
      }
      bVar14 = (long)(int)uVar4 == uVar4;
      JVar12.float64 = (double)(long)uVar4;
      if (bVar14) {
        JVar12.ptr = (void *)(uVar4 & 0xffffffff);
      }
      iVar9 = 7;
      if (bVar14) {
        iVar9 = 0;
      }
      val_04.tag = iVar9;
      val_04.u.float64 = JVar12.float64;
      iVar2 = JS_SetPropertyInternal(ctx,obj,0x30,val_04,0x4000);
      if (-1 < iVar2) goto LAB_00163932;
    }
    else {
      iVar2 = JS_CopySubArray(ctx,obj,local_98 + uVar6,local_60 + local_98,
                              local_50 - (local_60 + local_98),
                              (((long)uVar6 <= (long)local_60) - 1) +
                              (uint)((long)uVar6 <= (long)local_60));
      while (-1 < iVar2) {
        if ((long)local_50 <= (long)uVar4) goto LAB_0016387a;
        local_50 = local_50 - 1;
        iVar2 = JS_DeletePropertyInt64(ctx,obj,local_50,0x4000);
      }
    }
  }
LAB_0016341a:
  v.tag = JVar15.tag;
  if ((0xfffffff4 < uVar13) && (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,obj);
  }
  if (0xfffffff4 < (uint)JVar15.tag) {
    v.u.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar8 << 0x20);
    iVar2 = *v.u.ptr;
    *(int *)v.u.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_slice(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int splice)
{
    JSValue obj, arr, val, len_val;
    int64_t len, start, k, final, n, count, del_count, new_len;
    int kPresent;
    JSValue *arrp;
    uint32_t count32, i, item_count;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    if (splice) {
        if (argc == 0) {
            item_count = 0;
            del_count = 0;
        } else
        if (argc == 1) {
            item_count = 0;
            del_count = len - start;
        } else {
            item_count = argc - 2;
            if (JS_ToInt64Clamp(ctx, &del_count, argv[1], 0, len - start, 0))
                goto exception;
        }
        if (len + item_count - del_count > MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array loo long");
            goto exception;
        }
        count = del_count;
    } else {
        item_count = 0; /* avoid warning */
        final = len;
        if (!JS_IsUndefined(argv[1])) {
            if (JS_ToInt64Clamp(ctx, &final, argv[1], 0, len, len))
                goto exception;
        }
        count = max_int64(final - start, 0);
    }
    len_val = JS_NewInt64(ctx, count);
    arr = JS_ArraySpeciesCreate(ctx, obj, len_val);
    JS_FreeValue(ctx, len_val);
    if (JS_IsException(arr))
        goto exception;

    k = start;
    final = start + count;
    n = 0;
    /* The fast array test on arr ensures that
       JS_CreateDataPropertyUint32() won't modify obj in case arr is
       an exotic object */
    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) &&
        js_is_fast_array(ctx, arr)) {
        /* XXX: should share code with fast array constructor */
        for (; k < final && k < count32; k++, n++) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, JS_DupValue(ctx, arrp[k]), JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    /* Copy the remaining elements if any (handle case of inherited properties) */
    for (; k < final; k++, n++) {
        kPresent = JS_TryGetPropertyInt64(ctx, obj, k, &val);
        if (kPresent < 0)
            goto exception;
        if (kPresent) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, val, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    if (splice) {
        new_len = len + item_count - del_count;
        if (item_count != del_count) {
            if (JS_CopySubArray(ctx, obj, start + item_count,
                                start + del_count, len - (start + del_count),
                                item_count <= del_count ? +1 : -1) < 0)
                goto exception;

            for (k = len; k-- > new_len; ) {
                if (JS_DeletePropertyInt64(ctx, obj, k, JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
        for (i = 0; i < item_count; i++) {
            if (JS_SetPropertyInt64(ctx, obj, start + i, JS_DupValue(ctx, argv[i + 2])) < 0)
                goto exception;
        }
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, new_len)) < 0)
            goto exception;
    }
    JS_FreeValue(ctx, obj);
    return arr;

 exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}